

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O3

void float_values(WavpackStream *wps,int32_t *values,int32_t num_values)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  iVar3 = (uint)wps->float_shift + ((uint)wps->float_max_exp - (uint)wps->float_norm_exp);
  iVar5 = -0x20;
  if (-0x20 < iVar3) {
    iVar5 = iVar3;
  }
  iVar1 = 0;
  if (iVar5 < 0x20) {
    iVar1 = iVar5;
  }
  if (num_values != 0) {
    lVar4 = 0;
    do {
      iVar5 = values[lVar4];
      if (iVar3 < 1) {
        if (iVar3 < 0) {
          iVar5 = iVar5 >> (-(byte)iVar1 & 0x1f);
          goto LAB_001aee96;
        }
      }
      else {
        iVar5 = iVar5 << ((byte)iVar1 & 0x1f);
LAB_001aee96:
        values[lVar4] = iVar5;
      }
      iVar2 = 0x7fffff;
      if ((0x7fffff < iVar5) || (iVar2 = -0x800000, iVar5 < -0x800000)) {
        values[lVar4] = iVar2;
      }
      lVar4 = lVar4 + 1;
    } while (num_values != (int)lVar4);
  }
  return;
}

Assistant:

void float_values (WavpackStream *wps, int32_t *values, int32_t num_values)
{
    int shift = wps->float_max_exp - wps->float_norm_exp + wps->float_shift;

    if (shift > 32)
        shift = 32;
    else if (shift < -32)
        shift = -32;

    while (num_values--) {
        if (shift > 0)
            *values <<= shift;
        else if (shift < 0)
            *values >>= -shift;

        if (*values > 8388607L)
            *values = 8388607L;
        else if (*values < -8388608L)
            *values = -8388608L;

        values++;
    }
}